

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void dumpBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool inArray)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  byte *pbVar4;
  byte in_SIL;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t j_5;
  uint8_t c_1;
  size_t j_4;
  size_t j_3;
  size_t j_2;
  uint8_t c;
  size_t j_1;
  size_t j;
  size_t i;
  size_t len;
  ulong local_60;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_30;
  ulong local_28;
  long local_20;
  
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  for (local_20 = 0; local_20 + 8U <= sVar3; local_20 = local_20 + 8) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDI,local_20 + local_28);
      printf("%02hhx ",(ulong)*pbVar4);
    }
    if ((in_SIL & 1) != 0) {
      printf(" ");
    }
    printf("<");
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDI,local_20 + local_30);
      bVar1 = *pbVar4;
      iVar2 = isgraph((uint)bVar1);
      if (iVar2 == 0) {
        printf(".");
      }
      else {
        printf("%c",(ulong)bVar1);
      }
    }
    printf(">\n");
  }
  local_60 = sVar3 - local_20;
  if (local_60 != 0) {
    for (local_40 = 0; local_48 = local_60, local_40 < local_60; local_40 = local_40 + 1) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDI,local_20 + local_40);
      printf("%02hhx ",(ulong)*pbVar4);
    }
    for (; local_48 < 8; local_48 = local_48 + 1) {
      printf("   ");
    }
    if ((in_SIL & 1) != 0) {
      printf(" ");
    }
    printf("<");
    for (local_50 = 0; local_50 < local_60; local_50 = local_50 + 1) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDI,local_20 + local_50);
      bVar1 = *pbVar4;
      iVar2 = isgraph((uint)bVar1);
      if (iVar2 == 0) {
        printf(".");
      }
      else {
        printf("%c",(ulong)bVar1);
      }
    }
    for (; local_60 < 8; local_60 = local_60 + 1) {
      printf(" ");
    }
    printf(">\n");
  }
  return;
}

Assistant:

void dumpBytes(const std::vector<uint8_t>& value, bool inArray = false)
{
	size_t len = value.size();
	size_t i = 0;
	while (i + 8 <= len)
	{
		for (size_t j = 0; j < 8; j++)
		{
			printf("%02hhx ", value[i + j]);
		}
		if (inArray)
		{
			printf(" ");
		}
		printf("<");
		for (size_t j = 0; j < 8; j++)
		{
			uint8_t c = value[i + j];
			if (isgraph((int) c) == 0)
			{
				printf(".");
			}
			else
			{
				printf("%c", (int) c);
			}
		}
		printf(">\n");
		i += 8;
	}
	len -= i;
	if (len == 0)
	{
		return;
	}

	for (size_t j = 0; j < len; j++)
	{
		printf("%02hhx ", value[i + j]);
	}
	for (size_t j = len; j < 8; j++)
	{
		printf("   ");
	}
	if (inArray)
	{
		printf(" ");
	}
	printf("<");
	for (size_t j = 0; j < len; j++)
	{
		uint8_t c = value[i + j];
		if (isgraph((int) c) == 0)
		{
			printf(".");
		}
		else
		{
			printf("%c", (int) c);
		}
	}
	for (size_t j =len; j < 8; j++)
	{
		printf(" ");
	}
	printf(">\n");
}